

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall gss::innards::Proof::need_elimination(Proof *this,int p,int t)

{
  bool bVar1;
  type pbVar2;
  ostream *poVar3;
  pointer pIVar4;
  mapped_type *pmVar5;
  mapped_type_conflict *pmVar6;
  long lVar7;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  *in_stack_ffffffffffffff70;
  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  key_type *in_stack_ffffffffffffff78;
  map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
  *in_stack_ffffffffffffff80;
  pair<int,_int> in_stack_ffffffffffffffa8;
  map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
  *in_stack_ffffffffffffffb0;
  pair<int,_int> local_40;
  pair<long,_long> local_38;
  pair<int,_int> local_28;
  pair<long,_long> local_20;
  int local_10;
  int local_c [3];
  
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x18eb9f);
  std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_28,local_c,&local_10);
  std::pair<long,_long>::pair<int,_int,_true>(&local_20,&local_28);
  bVar1 = std::
          map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
          ::contains(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x18ebf7);
    pbVar2 = std::
             unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ::operator*(in_stack_ffffffffffffff70);
    std::operator<<(pbVar2,"# 0\n");
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x18ec1f);
    pbVar2 = std::
             unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ::operator*(in_stack_ffffffffffffff70);
    poVar3 = std::operator<<(pbVar2,"u 1 ~x");
    pIVar4 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18ec4c);
    this_00 = &pIVar4->variable_mappings;
    std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_40,local_c,&local_10);
    std::pair<long,_long>::pair<int,_int,_true>(&local_38,&local_40);
    pmVar5 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8);
    poVar3 = std::operator<<(poVar3,(string *)pmVar5);
    std::operator<<(poVar3," >= 1 ;\n");
    pIVar4 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18ecb5);
    lVar7 = pIVar4->proof_line + 1;
    pIVar4->proof_line = lVar7;
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x18ecd6);
    std::pair<int,_int>::pair<int_&,_int_&,_true>
              ((pair<int,_int> *)&stack0xffffffffffffffa8,local_c,&local_10);
    std::pair<long,_long>::pair<int,_int,_true>
              ((pair<long,_long> *)&stack0xffffffffffffffb0,
               (pair<int,_int> *)&stack0xffffffffffffffa8);
    pmVar6 = std::
             map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
             ::operator[](in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8);
    *pmVar6 = lVar7;
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x18ed2b);
    pbVar2 = std::
             unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          *)this_00);
    poVar3 = std::operator<<(pbVar2,"# ");
    pIVar4 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x18ed58);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pIVar4->active_level);
    std::operator<<(poVar3,'\n');
  }
  return;
}

Assistant:

auto Proof::need_elimination(int p, int t) -> void
{
    if (! _imp->eliminations.contains(pair{p, t})) {
        *_imp->proof_stream << "# 0\n";
        *_imp->proof_stream << "u 1 ~x" << _imp->variable_mappings[pair{p, t}] << " >= 1 ;\n";
        _imp->eliminations[pair{p, t}] = ++_imp->proof_line;
        *_imp->proof_stream << "# " << _imp->active_level << '\n';
    }
}